

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

matches * atomvec_a(iasctx *ctx,void *v,int spos)

{
  litem *plVar1;
  undefined8 uVar2;
  int *piVar3;
  char *__s1;
  char *__s;
  ull uVar4;
  void *__ptr;
  size_t sVar5;
  ulonglong uVar6;
  matches *pmVar7;
  match *__ptr_00;
  easm_expr_type eVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulonglong uVar15;
  easm_expr *peVar16;
  bool bVar17;
  ull local_118;
  char *end;
  match res;
  
  if (ctx->atomsnum != spos) {
    plVar1 = ctx->atoms[spos];
    uVar13 = 0;
    if (plVar1->type != LITEM_EXPR) {
      return (matches *)0x0;
    }
    memset(&res,0,0xb8);
    res.lpos = spos + 1;
    peVar16 = plVar1->expr;
    eVar8 = peVar16->type;
    if (eVar8 == EASM_EXPR_ZVEC) {
      __ptr = (void *)0x0;
    }
    else {
      uVar14 = 0;
      iVar10 = 0;
      __ptr = (void *)0x0;
      while (eVar8 == EASM_EXPR_VEC) {
        if ((long)iVar10 <= (long)uVar14) {
          bVar17 = iVar10 == 0;
          iVar10 = iVar10 * 2;
          if (bVar17) {
            iVar10 = 0x10;
          }
          __ptr = realloc(__ptr,(long)iVar10 << 3);
        }
        *(easm_expr **)((long)__ptr + uVar14 * 8) = peVar16->e2;
        uVar14 = uVar14 + 1;
        peVar16 = peVar16->e1;
        eVar8 = peVar16->type;
      }
      if (iVar10 <= (int)uVar14) {
        sVar5 = 0x80;
        if (iVar10 != 0) {
          sVar5 = (long)(iVar10 * 2) << 3;
        }
        __ptr = realloc(__ptr,sVar5);
      }
      uVar13 = (ulong)((int)uVar14 + 1);
      *(easm_expr **)((long)__ptr + (uVar14 & 0xffffffff) * 8) = peVar16;
    }
    iVar12 = (int)uVar13;
    uVar14 = (long)iVar12 / 2 & 0xffffffff;
    uVar9 = 0;
    iVar10 = iVar12;
    if ((int)((long)iVar12 / 2) < 1) {
      uVar14 = 0;
    }
    for (; iVar10 = iVar10 + -1, uVar14 != uVar9; uVar9 = uVar9 + 1) {
      uVar2 = *(undefined8 *)((long)__ptr + uVar9 * 8);
      *(undefined8 *)((long)__ptr + uVar9 * 8) = *(undefined8 *)((long)__ptr + (long)iVar10 * 8);
      *(undefined8 *)((long)__ptr + (long)iVar10 * 8) = uVar2;
    }
    local_118 = 0;
    uVar9 = 0;
    uVar15 = 0;
    for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      piVar3 = *(int **)((long)__ptr + uVar14 * 8);
      iVar10 = *piVar3;
      if (iVar10 != 0x14) {
        if (iVar10 != 0x11) {
          return (matches *)0x0;
        }
        __s1 = *(char **)(piVar3 + 0x10);
        __s = *v;
        sVar5 = strlen(__s);
        iVar10 = strncmp(__s1,__s,sVar5);
        if (iVar10 != 0) {
          return (matches *)0x0;
        }
        uVar6 = strtoull(__s1 + sVar5,&end,10);
        if (*end != '\0') {
          return (matches *)0x0;
        }
        uVar4 = uVar6;
        if ((uVar9 != 0) && (bVar17 = uVar6 != uVar15, uVar6 = uVar15, uVar4 = local_118, bVar17)) {
          return (matches *)0x0;
        }
        local_118 = uVar4;
        uVar15 = uVar6 + 1;
        uVar9 = uVar9 | 1L << (uVar14 & 0x3f);
      }
    }
    iVar10 = setbf(&res,*(bitfield **)((long)v + 8),local_118);
    if ((iVar10 != 0) &&
       (iVar10 = setbf(&res,*(bitfield **)((long)v + 0x10),(long)iVar12), iVar10 != 0)) {
      if (*(bitfield **)((long)v + 0x18) == (bitfield *)0x0) {
        if ((uVar9 ^ -1L << ((byte)uVar13 & 0x3f)) == 0xffffffffffffffff) goto LAB_0024d1ab;
      }
      else {
        iVar10 = setbf(&res,*(bitfield **)((long)v + 0x18),uVar9);
        if (iVar10 != 0) {
LAB_0024d1ab:
          pmVar7 = emptymatches();
          iVar10 = pmVar7->mnum;
          iVar12 = pmVar7->mmax;
          __ptr_00 = pmVar7->m;
          if (iVar12 <= iVar10) {
            iVar11 = iVar12 * 2;
            if (iVar12 == 0) {
              iVar11 = 0x10;
            }
            pmVar7->mmax = iVar11;
            __ptr_00 = (match *)realloc(__ptr_00,(long)iVar11 * 0xb8);
            pmVar7->m = __ptr_00;
          }
          pmVar7->mnum = iVar10 + 1;
          memcpy(__ptr_00 + iVar10,&res,0xb8);
          return pmVar7;
        }
      }
    }
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomvec_a APROTO {
	const struct vec *vec = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct match res = { 0, .lpos = spos+1 };
	const struct easm_expr *expr = ctx->atoms[spos]->expr;
	const struct easm_expr **vexprs = 0;
	int vexprsnum = 0;
	int vexprsmax = 0;
	if (expr->type != EASM_EXPR_ZVEC) {
		while (expr->type == EASM_EXPR_VEC) {
			ADDARRAY(vexprs, expr->e2);
			expr = expr->e1;
		}
		ADDARRAY(vexprs, expr);
	}
	int i;
	for (i = 0; i < vexprsnum/2; i++) {
		const struct easm_expr *tmp = vexprs[i];
		vexprs[i] = vexprs[vexprsnum-1-i];
		vexprs[vexprsnum-1-i] = tmp;
	}
	ull start = 0, cnt = vexprsnum, mask = 0, cur = 0;
	for (i = 0; i < cnt; i++) {
		const struct easm_expr *e = vexprs[i];
		if (e->type == EASM_EXPR_DISCARD) {
		} else if (e->type == EASM_EXPR_REG) {
			if (strncmp(e->str, vec->name, strlen(vec->name)))
				return 0;
			char *end;
			ull num = strtoull(e->str + strlen(vec->name), &end, 10);
			if (*end)
				return 0;
			if (mask) {
				if (num != cur)
					return 0;
				cur++;
			} else {
				start = num;
				cur = num + 1;
			}
			mask |= 1ull << i;
		} else {
			return 0;
		}
	}
	if (!setbf(&res, vec->bf, start))
		return 0;
	if (!setbf(&res, vec->cnt, cnt))
		return 0;
	if (vec->mask) {
		if (!setbf(&res, vec->mask, mask))
			return 0;
	} else {
		if (mask != (1ull << cnt) - 1)
		       return 0;	
	}
	struct matches *rres = emptymatches();
	ADDARRAY(rres->m, res);
	return rres;
}